

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGSchemaTypeCompare
              (void *data,xmlChar *type,xmlChar *value1,xmlNodePtr ctxt1,void *comp1,xmlChar *value2
              ,xmlNodePtr ctxt2)

{
  xmlSchemaValPtr pxVar1;
  int iVar2;
  xmlSchemaTypePtr type_00;
  uint uVar3;
  xmlSchemaValPtr res1;
  xmlSchemaValPtr res2;
  
  res1 = (xmlSchemaValPtr)0x0;
  res2 = (xmlSchemaValPtr)0x0;
  uVar3 = 0xffffffff;
  if (((value2 != (xmlChar *)0x0 && (value1 != (xmlChar *)0x0 && type != (xmlChar *)0x0)) &&
      (type_00 = xmlSchemaGetPredefinedType(type,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
      type_00 != (xmlSchemaTypePtr)0x0)) &&
     ((pxVar1 = (xmlSchemaValPtr)comp1, comp1 != (void *)0x0 ||
      ((iVar2 = xmlSchemaValPredefTypeNode(type_00,value1,&res1,ctxt1), iVar2 == 0 &&
       (pxVar1 = res1, res1 != (xmlSchemaValPtr)0x0)))))) {
    res1 = pxVar1;
    iVar2 = xmlSchemaValPredefTypeNode(type_00,value2,&res2,ctxt2);
    if (iVar2 == 0) {
      iVar2 = xmlSchemaCompareValues(res1,res2);
      if (res1 != (xmlSchemaValPtr)comp1) {
        xmlSchemaFreeValue(res1);
      }
      xmlSchemaFreeValue(res2);
      uVar3 = 0xffffffff;
      if (iVar2 != -2) {
        uVar3 = (uint)(iVar2 == 0);
      }
    }
    else if (res1 != (xmlSchemaValPtr)comp1) {
      xmlSchemaFreeValue(res1);
    }
  }
  return uVar3;
}

Assistant:

static int
xmlRelaxNGSchemaTypeCompare(void *data ATTRIBUTE_UNUSED,
                            const xmlChar * type,
                            const xmlChar * value1,
                            xmlNodePtr ctxt1,
                            void *comp1,
                            const xmlChar * value2, xmlNodePtr ctxt2)
{
    int ret;
    xmlSchemaTypePtr typ;
    xmlSchemaValPtr res1 = NULL, res2 = NULL;

    if ((type == NULL) || (value1 == NULL) || (value2 == NULL))
        return (-1);
    typ = xmlSchemaGetPredefinedType(type,
                                     BAD_CAST
                                     "http://www.w3.org/2001/XMLSchema");
    if (typ == NULL)
        return (-1);
    if (comp1 == NULL) {
        ret = xmlSchemaValPredefTypeNode(typ, value1, &res1, ctxt1);
        if (ret != 0)
            return (-1);
        if (res1 == NULL)
            return (-1);
    } else {
        res1 = (xmlSchemaValPtr) comp1;
    }
    ret = xmlSchemaValPredefTypeNode(typ, value2, &res2, ctxt2);
    if (ret != 0) {
	if (res1 != (xmlSchemaValPtr) comp1)
	    xmlSchemaFreeValue(res1);
        return (-1);
    }
    ret = xmlSchemaCompareValues(res1, res2);
    if (res1 != (xmlSchemaValPtr) comp1)
        xmlSchemaFreeValue(res1);
    xmlSchemaFreeValue(res2);
    if (ret == -2)
        return (-1);
    if (ret == 0)
        return (1);
    return (0);
}